

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

void __thiscall
Imf_3_3::Context::Context
          (Context *this,char *filename,ContextInitializer *ctxtinit,read_mode_t param_4)

{
  ostream *poVar1;
  undefined8 uVar2;
  stringstream *text;
  char *in_RSI;
  __shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  exr_result_t rv;
  stringstream *in_stack_fffffffffffffc78;
  ArgExc *in_stack_fffffffffffffc80;
  stringstream local_348 [16];
  ostream local_338 [32];
  exr_context_initializer_t *in_stack_fffffffffffffce8;
  char *in_stack_fffffffffffffcf0;
  exr_context_t *in_stack_fffffffffffffcf8;
  stringstream local_1c0 [16];
  ostream local_1b0 [396];
  exr_result_t local_24;
  char *local_18;
  
  local_18 = in_RSI;
  Context((Context *)in_stack_fffffffffffffc80);
  std::__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>::get(in_RDI);
  local_24 = exr_start_read(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                            in_stack_fffffffffffffce8);
  if (local_24 == 0) {
    return;
  }
  if (local_24 == 0xd) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar1 = std::operator<<(local_1b0,"Invalid or missing attribute when attempting to open \'");
    poVar1 = std::operator<<(poVar1,local_18);
    std::operator<<(poVar1,"\' for read");
    uVar2 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_348);
  poVar1 = std::operator<<(local_338,"Unable to open \'");
  poVar1 = std::operator<<(poVar1,local_18);
  std::operator<<(poVar1,"\' for read");
  text = (stringstream *)__cxa_allocate_exception(0x48);
  Iex_3_3::InputExc::InputExc((InputExc *)poVar1,text);
  __cxa_throw(text,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
}

Assistant:

Context::Context (const char* filename, const ContextInitializer& ctxtinit, read_mode_t)
    : Context()
{
    exr_result_t rv;

    rv = exr_start_read (_ctxt.get (), filename, &(ctxtinit._initializer));
    if (EXR_ERR_SUCCESS != rv)
    {
        if (rv == EXR_ERR_MISSING_REQ_ATTR)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Invalid or missing attribute when attempting to open '"
                << filename << "' for read");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Unable to open '" << filename << "' for read");
        }
    }
}